

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::JSONTreeRenderer::ToStreamInternal(JSONTreeRenderer *this,RenderTree *root,ostream *ss)

{
  yyjson_val_pool *pool;
  ulong uVar1;
  bool bVar2;
  yyjson_mut_doc *doc;
  yyjson_mut_val *pyVar3;
  char *__ptr;
  InternalException *this_00;
  yyjson_mut_val *pyVar4;
  yyjson_mut_val *val;
  allocator local_51;
  string local_50;
  
  val = (yyjson_mut_val *)0x0;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) goto LAB_018fc5db;
  pool = &doc->val_pool;
  val = (doc->val_pool).cur;
  if ((doc->val_pool).end == val) {
    bVar2 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
    if (bVar2) {
      val = pool->cur;
      goto LAB_018fc5c0;
    }
LAB_018fc6b0:
    val = (yyjson_mut_val *)0x0;
  }
  else {
LAB_018fc5c0:
    pool->cur = val + 1;
    if (val == (yyjson_mut_val *)0x0) goto LAB_018fc6b0;
    val->tag = 6;
  }
  doc->root = val;
LAB_018fc5db:
  pyVar3 = RenderRecursive(doc,root,0,0);
  if (((val != (yyjson_mut_val *)0x0) && (pyVar3 != (yyjson_mut_val *)0x0)) &&
     (uVar1 = val->tag, ((uint)uVar1 & 7) == 6)) {
    val->tag = (uVar1 & 0xfffffffffffffffe) + 0x100;
    pyVar4 = pyVar3;
    if (0xff < uVar1) {
      pyVar4 = *(yyjson_mut_val **)((val->uni).u64 + 0x10);
      *(yyjson_mut_val **)((val->uni).u64 + 0x10) = pyVar3;
    }
    pyVar3->next = pyVar4;
    (val->uni).str = (char *)pyVar3;
  }
  __ptr = duckdb_yyjson::yyjson_mut_val_write_opts
                    (val,9,(yyjson_alc *)0x0,(usize *)0x0,(yyjson_write_err *)0x0);
  if (__ptr != (char *)0x0) {
    ::std::__cxx11::string::string((string *)&local_50,__ptr,&local_51);
    ::std::operator<<(ss,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    free(__ptr);
    duckdb_yyjson::yyjson_mut_doc_free(doc);
    return;
  }
  duckdb_yyjson::yyjson_mut_doc_free(doc);
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"The plan could not be rendered as JSON, yyjson failed",&local_51);
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void JSONTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	auto doc = yyjson_mut_doc_new(nullptr);
	auto result_obj = yyjson_mut_arr(doc);
	yyjson_mut_doc_set_root(doc, result_obj);

	auto plan = RenderRecursive(doc, root, 0, 0);
	yyjson_mut_arr_append(result_obj, plan);

	auto data = yyjson_mut_val_write_opts(result_obj, YYJSON_WRITE_ALLOW_INF_AND_NAN | YYJSON_WRITE_PRETTY, nullptr,
	                                      nullptr, nullptr);
	if (!data) {
		yyjson_mut_doc_free(doc);
		throw InternalException("The plan could not be rendered as JSON, yyjson failed");
	}
	ss << string(data);
	free(data);
	yyjson_mut_doc_free(doc);
}